

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxList * amrex::GetBndryCells(BoxArray *ba,int ngrow)

{
  bool bVar1;
  Long LVar2;
  iterator bl;
  int in_EDX;
  BoxList *in_RDI;
  pair<int,_amrex::Box> *isec;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range3;
  Box *gbx;
  iterator __end1;
  iterator __begin1;
  BoxList *__range1;
  BoxList bl_tmp;
  BoxList pieces;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box result;
  Box *bx;
  int N;
  int i;
  BoxList bl_diff;
  BoxArray tba;
  BoxList bcells;
  IndexType btype;
  BoxList *gcells;
  BoxArray *in_stack_fffffffffffffdc8;
  BoxList *in_stack_fffffffffffffdd0;
  BoxArray *this;
  undefined8 *puVar3;
  BoxArray *in_stack_fffffffffffffde0;
  undefined1 best;
  BoxList *this_00;
  BoxList *bl_00;
  BoxArray *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_1d0 [3];
  element_type *local_1b8;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  in_stack_fffffffffffffe50;
  element_type *in_stack_fffffffffffffe58;
  BoxList *bl_01;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  uint uVar4;
  undefined1 local_150 [24];
  BoxArray local_138;
  uint local_c8;
  byte local_c1;
  BoxArray *in_stack_ffffffffffffff68;
  BoxList local_48;
  uint local_28;
  int local_24;
  int local_c;
  undefined8 *local_8;
  
  this_00 = in_RDI;
  local_24 = in_EDX;
  local_28 = (uint)BoxArray::ixType(in_stack_fffffffffffffdc8);
  bl_00 = &local_48;
  BoxArray::boxList(in_stack_ffffffffffffff68);
  BoxList::simplify(this_00,SUB81((ulong)in_RDI >> 0x38,0));
  BoxArray::BoxArray(in_stack_fffffffffffffe00,bl_00);
  local_c1 = 0;
  local_c8 = local_28;
  BoxList::BoxList((BoxList *)in_stack_fffffffffffffdc8,
                   (IndexType)(uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
  local_138.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_28;
  BoxList::BoxList((BoxList *)in_stack_fffffffffffffdc8,
                   (IndexType)(uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
  local_138.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  LVar2 = BoxArray::size((BoxArray *)0xfd0ea3);
  local_138.m_bat.m_op.m_bndryReg.m_doihi.vect[2] = (int)LVar2;
  for (; (int)local_138.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr <
         local_138.m_bat.m_op.m_bndryReg.m_doihi.vect[2];
      local_138.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           (int)local_138.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           + 1) {
    puVar3 = (undefined8 *)((long)&local_138.m_bat + 0x1c);
    BoxArray::operator[](in_stack_fffffffffffffde0,(int)((ulong)puVar3 >> 0x20));
    local_c = local_24;
    local_138.m_bat._0_8_ = *puVar3;
    local_138.m_bat.m_op._16_8_ = *(undefined8 *)((long)puVar3 + 0x14);
    local_138.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
         (int)((ulong)*(undefined8 *)((long)puVar3 + 0xc) >> 0x20);
    local_138.m_bat.m_op.m_bndryReg.m_typ.itype = SUB84(puVar3[1],0);
    local_138.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = (int)((ulong)puVar3[1] >> 0x20);
    in_stack_fffffffffffffde0 = &local_138;
    local_138.m_bat.m_op._52_8_ = puVar3;
    local_8 = puVar3;
    Box::grow((Box *)in_stack_fffffffffffffde0,local_24);
    boxDiff((BoxList *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
            (Box *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50._M_current);
    BoxList::join((BoxList *)in_stack_fffffffffffffe00,bl_00);
  }
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0xfd0ffb);
  BoxList::clear((BoxList *)0xfd1008);
  BoxList::BoxList((BoxList *)in_stack_fffffffffffffdc8,
                   (IndexType)(uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
  uVar4 = local_28;
  BoxList::BoxList((BoxList *)in_stack_fffffffffffffdc8,
                   (IndexType)(uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
  bl_01 = in_RDI;
  bl = BoxList::begin((BoxList *)in_stack_fffffffffffffdc8);
  local_1b8 = (element_type *)BoxList::end((BoxList *)in_stack_fffffffffffffdc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_fffffffffffffdc8);
    best = (undefined1)((ulong)in_RDI >> 0x38);
    if (!bVar1) break;
    local_1d0[2]._M_current =
         (pair<int,_amrex::Box> *)
         __gnu_cxx::
         __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
         operator*((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                    *)&stack0xfffffffffffffe50);
    BoxArray::intersections
              ((BoxArray *)in_stack_fffffffffffffe10,(Box *)in_stack_fffffffffffffe08,
               (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffffe00);
    bVar1 = std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
            empty((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   *)in_stack_fffffffffffffde0);
    if (bVar1) {
      BoxList::push_back(in_stack_fffffffffffffdd0,(Box *)in_stack_fffffffffffffdc8);
    }
    else {
      BoxList::clear((BoxList *)0xfd1166);
      local_1d0[1]._M_current = (pair<int,_amrex::Box> *)local_150;
      local_1d0[0]._M_current =
           (pair<int,_amrex::Box> *)
           std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
           begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffdc8);
      std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::end
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffdc8);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                            *)in_stack_fffffffffffffdd0,
                           (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                            *)in_stack_fffffffffffffdc8);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
        ::operator*(local_1d0);
        BoxList::push_back(in_stack_fffffffffffffdd0,(Box *)in_stack_fffffffffffffdc8);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
        ::operator++(local_1d0);
      }
      BoxList::complementIn
                ((BoxList *)CONCAT44(uVar4,in_stack_fffffffffffffe60),(Box *)bl_01,
                 (BoxList *)bl._M_current);
      BoxList::join((BoxList *)in_stack_fffffffffffffe00,bl_00);
    }
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)&stack0xfffffffffffffe50);
  }
  removeOverlap(bl_01);
  this = (BoxArray *)&stack0xfffffffffffffe00;
  BoxList::operator=((BoxList *)this,(BoxList *)in_stack_fffffffffffffdc8);
  BoxList::~BoxList((BoxList *)0xfd1258);
  BoxList::simplify(this_00,(bool)best);
  local_c1 = 1;
  BoxList::~BoxList((BoxList *)0xfd127b);
  BoxList::~BoxList((BoxList *)0xfd1288);
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             in_stack_fffffffffffffde0);
  BoxList::~BoxList((BoxList *)0xfd12a2);
  if ((local_c1 & 1) == 0) {
    BoxList::~BoxList((BoxList *)0xfd12e1);
  }
  BoxArray::~BoxArray(this);
  BoxList::~BoxList((BoxList *)0xfd12fb);
  return this_00;
}

Assistant:

BoxList
GetBndryCells (const BoxArray& ba,
               int             ngrow)
{
    BL_ASSERT(ba.ok());
    BL_ASSERT(ba.size() > 0);
    //
    // First get list of all ghost cells.
    //
    const IndexType btype = ba.ixType();

    BoxList bcells = ba.boxList();
    bcells.simplify();

    BoxArray tba(bcells);

    BoxList gcells(btype);
    BoxList bl_diff(btype);
    for (int i = 0, N = tba.size(); i < N; ++i)
    {
        const Box& bx = tba[i];
        amrex::boxDiff(bl_diff, amrex::grow(bx,ngrow), bx);
        gcells.join(bl_diff);
    }
    //
    // Now strip out intersections with original BoxArray.
    //
    std::vector< std::pair<int,Box> > isects;

    bcells.clear();
    BoxList pieces(btype);
    BoxList bl_tmp(btype);

    for (const Box& gbx : gcells)
    {
        tba.intersections(gbx, isects);
        if (isects.empty())
        {
            bcells.push_back(gbx);
        }
        else
        {
            pieces.clear();
            for (const auto& isec : isects) {
                pieces.push_back(isec.second);
            }
            bl_tmp.complementIn(gbx,pieces);
            bcells.join(bl_tmp);
        }
    }

    gcells = amrex::removeOverlap(bcells);
    gcells.simplify();

    return gcells;
}